

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_crt_ext(uchar **p,uchar *end,mbedtls_x509_crt *crt)

{
  int iVar1;
  uchar *end_00;
  uint local_68;
  int local_64;
  int ext_type;
  int is_critical;
  mbedtls_x509_buf extn_oid;
  uchar *end_ext_octet;
  uchar *end_ext_data;
  size_t len;
  mbedtls_x509_crt *pmStack_28;
  int ret;
  mbedtls_x509_crt *crt_local;
  uchar *end_local;
  uchar **p_local;
  
  pmStack_28 = crt;
  crt_local = (mbedtls_x509_crt *)end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_x509_get_ext(p,end,&crt->v3_ext,3);
  if (p_local._4_4_ == 0) {
    len._4_4_ = 0;
    do {
      while( true ) {
        if (crt_local <= *(mbedtls_x509_crt **)end_local) {
          if (*(mbedtls_x509_crt **)end_local != crt_local) {
            return -0x2566;
          }
          return 0;
        }
        memset(&ext_type,0,0x18);
        local_64 = 0;
        local_68 = 0;
        len._4_4_ = mbedtls_asn1_get_tag
                              ((uchar **)end_local,(uchar *)crt_local,(size_t *)&end_ext_data,0x30);
        if (len._4_4_ != 0) {
          return len._4_4_ + -0x2500;
        }
        end_00 = end_ext_data + *(long *)end_local;
        ext_type = (int)**(byte **)end_local;
        len._4_4_ = mbedtls_asn1_get_tag
                              ((uchar **)end_local,(uchar *)crt_local,(size_t *)&extn_oid,6);
        if (len._4_4_ != 0) {
          return len._4_4_ + -0x2500;
        }
        extn_oid.len = *(size_t *)end_local;
        *(long *)end_local = extn_oid._0_8_ + *(long *)end_local;
        if ((long)crt_local - *(long *)end_local < 1) {
          return -0x2560;
        }
        len._4_4_ = mbedtls_asn1_get_bool((uchar **)end_local,end_00,&local_64);
        if ((len._4_4_ != 0) && (len._4_4_ != -0x62)) {
          return len._4_4_ + -0x2500;
        }
        len._4_4_ = mbedtls_asn1_get_tag((uchar **)end_local,end_00,(size_t *)&end_ext_data,4);
        if (len._4_4_ != 0) {
          return len._4_4_ + -0x2500;
        }
        extn_oid.p = end_ext_data + *(long *)end_local;
        if (extn_oid.p != end_00) {
          return -0x2566;
        }
        len._4_4_ = mbedtls_oid_get_x509_ext_type((mbedtls_asn1_buf *)&ext_type,(int *)&local_68);
        if (len._4_4_ != 0) break;
        if ((pmStack_28->ext_types & local_68) != 0) {
          return -0x2500;
        }
        pmStack_28->ext_types = pmStack_28->ext_types | local_68;
        if (local_68 == 4) {
          iVar1 = x509_get_key_usage((uchar **)end_local,extn_oid.p,&pmStack_28->key_usage);
        }
        else if (local_68 == 0x20) {
          iVar1 = x509_get_subject_alt_name
                            ((uchar **)end_local,extn_oid.p,&pmStack_28->subject_alt_names);
        }
        else if (local_68 == 0x100) {
          iVar1 = x509_get_basic_constraints
                            ((uchar **)end_local,extn_oid.p,&pmStack_28->ca_istrue,
                             &pmStack_28->max_pathlen);
        }
        else if (local_68 == 0x800) {
          iVar1 = x509_get_ext_key_usage((uchar **)end_local,extn_oid.p,&pmStack_28->ext_key_usage);
        }
        else {
          if (local_68 != 0x10000) {
            return -0x2080;
          }
          iVar1 = x509_get_ns_cert_type((uchar **)end_local,extn_oid.p,&pmStack_28->ns_cert_type);
        }
        if (iVar1 != 0) {
          return iVar1;
        }
        len._4_4_ = 0;
      }
      *(uchar **)end_local = extn_oid.p;
    } while (local_64 == 0);
    p_local._4_4_ = -0x2562;
  }
  else if (p_local._4_4_ == -0x62) {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_crt_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_crt *crt )
{
    int ret;
    size_t len;
    unsigned char *end_ext_data, *end_ext_octet;

    if( ( ret = mbedtls_x509_get_ext( p, end, &crt->v3_ext, 3 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    while( *p < end )
    {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        mbedtls_x509_buf extn_oid = {0, 0, NULL};
        int is_critical = 0; /* DEFAULT FALSE */
        int ext_type = 0;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_data = *p + len;

        /* Get extension ID */
        extn_oid.tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &extn_oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        extn_oid.p = *p;
        *p += extn_oid.len;

        if( ( end - *p ) < 1 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_OUT_OF_DATA );

        /* Get optional critical */
        if( ( ret = mbedtls_asn1_get_bool( p, end_ext_data, &is_critical ) ) != 0 &&
            ( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        /* Data should be octet string type */
        if( ( ret = mbedtls_asn1_get_tag( p, end_ext_data, &len,
                MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_octet = *p + len;

        if( end_ext_octet != end_ext_data )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

        /*
         * Detect supported extensions
         */
        ret = mbedtls_oid_get_x509_ext_type( &extn_oid, &ext_type );

        if( ret != 0 )
        {
            /* No parser found, skip extension */
            *p = end_ext_octet;

#if !defined(MBEDTLS_X509_ALLOW_UNSUPPORTED_CRITICAL_EXTENSION)
            if( is_critical )
            {
                /* Data is marked as critical: fail */
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
            }
#endif
            continue;
        }

        /* Forbid repeated extensions */
        if( ( crt->ext_types & ext_type ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS );

        crt->ext_types |= ext_type;

        switch( ext_type )
        {
        case MBEDTLS_X509_EXT_BASIC_CONSTRAINTS:
            /* Parse basic constraints */
            if( ( ret = x509_get_basic_constraints( p, end_ext_octet,
                    &crt->ca_istrue, &crt->max_pathlen ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_KEY_USAGE:
            /* Parse key usage */
            if( ( ret = x509_get_key_usage( p, end_ext_octet,
                    &crt->key_usage ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE:
            /* Parse extended key usage */
            if( ( ret = x509_get_ext_key_usage( p, end_ext_octet,
                    &crt->ext_key_usage ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_SUBJECT_ALT_NAME:
            /* Parse subject alt name */
            if( ( ret = x509_get_subject_alt_name( p, end_ext_octet,
                    &crt->subject_alt_names ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_NS_CERT_TYPE:
            /* Parse netscape certificate type */
            if( ( ret = x509_get_ns_cert_type( p, end_ext_octet,
                    &crt->ns_cert_type ) ) != 0 )
                return( ret );
            break;

        default:
            return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE );
        }
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}